

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

char * QStringConverterICU::fromUtf16(char *out,QStringView in,State *state)

{
  undefined8 uVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  const_pointer pvVar5;
  qsizetype qVar6;
  qsizetype qVar7;
  undefined1 *in_RCX;
  char *in_RDI;
  long in_FS_OFFSET;
  int32_t leftOver;
  UBool flush;
  char *targetLimit;
  qsizetype length;
  UChar_conflict *sourceLimit;
  UConverter *icu_conv;
  void *context;
  UConverterFromUCallback action;
  char *target;
  UChar_conflict *source;
  UErrorCode err;
  Flag in_stack_ffffffffffffff5c;
  QFlagsStorage<QStringConverterBase::Flag> *this;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  const_pointer local_28;
  QFlagsStorage<QStringConverterBase::Flag> local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ensureConverter((State *)0x549010);
  uVar1 = *(undefined8 *)(in_RCX + 0x18);
  local_1c.i = 0;
  local_28 = QStringView::data(&local_18);
  pvVar5 = QStringView::data(&local_18);
  qVar6 = QStringView::size(&local_18);
  qVar7 = QStringView::size(&local_18);
  cVar2 = ucnv_getMaxCharSize_70(uVar1);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = in_RDI;
  ucnv_getFromUCallBack_70(uVar1,&local_38,&local_40);
  if (local_40 != in_RCX) {
    ucnv_setFromUCallBack_70(uVar1,local_38,in_RCX,0,0,&local_1c);
  }
  this = &local_1c;
  ucnv_fromUnicode_70(uVar1,&local_30,in_RDI + ((int)qVar7 + 10) * (int)cVar2,&local_28,
                      pvVar5 + qVar6,0,0);
  bVar3 = QFlags<QStringConverterBase::Flag>::testFlag
                    ((QFlags<QStringConverterBase::Flag> *)this,in_stack_ffffffffffffff5c);
  if ((bVar3) && (iVar4 = ucnv_fromUCountPending_70(uVar1,&local_1c), iVar4 != 0)) {
    ucnv_reset_70(uVar1);
    *(long *)(in_RCX + 0x10) = (long)iVar4 + *(long *)(in_RCX + 0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

static char *fromUtf16(char *out, QStringView in, QStringConverter::State *state)
    {
        QT_COM_THREAD_INIT
        ensureConverter(state);
        auto icu_conv = static_cast<UConverter *>(state->d[0]);
        UErrorCode err = U_ZERO_ERROR;
        auto source = reinterpret_cast<const UChar *>(in.data());
        auto sourceLimit = reinterpret_cast<const UChar *>(in.data() + in.size());

        qsizetype length = UCNV_GET_MAX_BYTES_FOR_STRING(in.size(), ucnv_getMaxCharSize(icu_conv));

        char *target = out;
        char *targetLimit = out + length;
        UBool flush = false;

        // If the QStringConverter was moved, the state that we used as a context is stale now.
        UConverterFromUCallback action;
        const void *context;
        ucnv_getFromUCallBack(icu_conv, &action, &context);
        if (context != state)
             ucnv_setFromUCallBack(icu_conv, action, state, nullptr, nullptr, &err);

        ucnv_fromUnicode(icu_conv, &target, targetLimit, &source, sourceLimit, nullptr, flush, &err);
        // We did reserve enough space:
        Q_ASSERT(err != U_BUFFER_OVERFLOW_ERROR);
        if (state->flags.testFlag(QStringConverter::Flag::Stateless)) {
            if (auto leftOver = ucnv_fromUCountPending(icu_conv, &err)) {
                ucnv_reset(icu_conv);
                state->invalidChars += leftOver;
            }
        }
        return target;
    }